

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> __thiscall
kj::MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
          (MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this,Mutex *param_2)

{
  Impl *extraout_RDX;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> LVar1;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_30;
  Mutex *local_20;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_local;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_10;
  
  local_20 = param_2;
  local_10 = this;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe();
  kj::_::Mutex::lock(param_2,1,&local_30);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_30);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)this,param_2,
             (Impl *)(param_2 + 1));
  LVar1.ptr = extraout_RDX;
  LVar1.mutex = &this->mutex;
  return LVar1;
}

Assistant:

inline Locked<const T> MutexGuarded<T>::lockShared(LockSourceLocationArg location) const {
  mutex.lock(_::Mutex::SHARED, kj::none, location);
  return Locked<const T>(mutex, value);
}